

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_upstream_hash_module.c
# Opt level: O3

int ngx_stream_upstream_chash_cmp_points(void *one,void *two)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*two <= *one) {
    uVar1 = (uint)(*two < *one);
  }
  return uVar1;
}

Assistant:

static int ngx_libc_cdecl
ngx_stream_upstream_chash_cmp_points(const void *one, const void *two)
{
    ngx_stream_upstream_chash_point_t *first =
                                     (ngx_stream_upstream_chash_point_t *) one;
    ngx_stream_upstream_chash_point_t *second =
                                     (ngx_stream_upstream_chash_point_t *) two;

    if (first->hash < second->hash) {
        return -1;

    } else if (first->hash > second->hash) {
        return 1;

    } else {
        return 0;
    }
}